

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_audio.h
# Opt level: O3

wchar_t saudio_push(float *frames,wchar_t num_frames)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  int iVar4;
  int iVar5;
  
  if ((frames == (float *)0x0) || (num_frames < L'\x01')) {
    __assert_fail("frames && (num_frames > 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_audio.h"
                  ,0x84f,"int saudio_push(const float *, int)");
  }
  wVar3 = L'\0';
  if (_saudio.valid) {
    iVar5 = num_frames * _saudio.bytes_per_frame;
    iVar4 = iVar5;
    if (iVar5 < 1) {
      iVar5 = 0;
      if (_saudio.bytes_per_frame != 0) {
        __assert_fail("all_to_copy == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_audio.h"
                      ,0x43e,"int _saudio_fifo_write(_saudio_fifo_t *, const uint8_t *, int)");
      }
    }
    else {
      do {
        if (_saudio.fifo.cur_packet == -1) {
          pthread_mutex_lock((pthread_mutex_t *)&_saudio.fifo.mutex);
          if (_saudio.fifo.write_queue.head != _saudio.fifo.write_queue.tail) {
            wVar3 = _saudio_ring_dequeue(&_saudio.fifo.write_queue);
            _saudio.fifo.cur_packet = wVar3;
          }
          pthread_mutex_unlock((pthread_mutex_t *)&_saudio.fifo.mutex);
          if (_saudio.fifo.cur_offset != 0) {
            __assert_fail("fifo->cur_offset == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_audio.h"
                          ,0x41e,"int _saudio_fifo_write(_saudio_fifo_t *, const uint8_t *, int)");
          }
          iVar2 = 0;
          if (_saudio.fifo.cur_packet == -1) {
            iVar5 = iVar5 - iVar4;
            if (iVar5 < 0) {
              __assert_fail("(bytes_copied >= 0) && (bytes_copied < num_bytes)",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_audio.h"
                            ,0x432,"int _saudio_fifo_write(_saudio_fifo_t *, const uint8_t *, int)")
              ;
            }
            break;
          }
        }
        else {
          iVar2 = _saudio.fifo.cur_offset;
        }
        iVar1 = _saudio.fifo.packet_size - iVar2;
        if (iVar4 < _saudio.fifo.packet_size - iVar2) {
          iVar1 = iVar4;
        }
        memcpy(_saudio.fifo.base_ptr +
               (long)iVar2 + (long)(_saudio.fifo.cur_packet * _saudio.fifo.packet_size),frames,
               (long)iVar1);
        iVar2 = _saudio.fifo.cur_offset + iVar1;
        _saudio.fifo.cur_offset = iVar2;
        if (_saudio.fifo.packet_size < iVar2) {
          __assert_fail("fifo->cur_offset <= fifo->packet_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_audio.h"
                        ,0x42c,"int _saudio_fifo_write(_saudio_fifo_t *, const uint8_t *, int)");
        }
        iVar4 = iVar4 - iVar1;
        if (iVar4 < 0) {
          __assert_fail("all_to_copy >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_audio.h"
                        ,0x42d,"int _saudio_fifo_write(_saudio_fifo_t *, const uint8_t *, int)");
        }
        if (iVar2 == _saudio.fifo.packet_size) {
          pthread_mutex_lock((pthread_mutex_t *)&_saudio.fifo.mutex);
          _saudio_ring_enqueue(&_saudio.fifo.read_queue,_saudio.fifo.cur_packet);
          pthread_mutex_unlock((pthread_mutex_t *)&_saudio.fifo.mutex);
          _saudio.fifo.cur_packet = -1;
          _saudio.fifo.cur_offset = 0;
        }
        frames = (float *)((long)frames + (long)iVar1);
      } while (iVar4 != 0);
    }
    wVar3 = iVar5 / _saudio.bytes_per_frame;
  }
  return wVar3;
}

Assistant:

SOKOL_API_IMPL int saudio_push(const float* frames, int num_frames) {
    SOKOL_ASSERT(frames && (num_frames > 0));
    if (_saudio.valid) {
        const int num_bytes = num_frames * _saudio.bytes_per_frame;
        const int num_written = _saudio_fifo_write(&_saudio.fifo, (const uint8_t*)frames, num_bytes);
        return num_written / _saudio.bytes_per_frame;
    }
    else {
        return 0;
    }
}